

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDALine.h
# Opt level: O2

void __thiscall
TRM::dda2_line_interpolator::dda2_line_interpolator
          (dda2_line_interpolator *this,int y1,int y2,int count)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if (1 < count) {
    iVar2 = count;
  }
  this->m_cnt = iVar2;
  iVar1 = (y2 - y1) / iVar2;
  iVar2 = (y2 - y1) % iVar2;
  this->m_lft = iVar1;
  this->m_rem = iVar2;
  this->m_y = y1;
  if (iVar2 < 1) {
    iVar2 = iVar2 + count;
    this->m_rem = iVar2;
    this->m_lft = iVar1 + -1;
  }
  this->m_mod = iVar2 - count;
  return;
}

Assistant:

dda2_line_interpolator(int y1, int y2, int count)
      : m_cnt(count <= 0 ? 1 : count),
        m_lft((y2 - y1) / m_cnt),
        m_rem((y2 - y1) % m_cnt),
        m_mod(m_rem),
        m_y(y1) {
    if (m_mod <= 0) {
      m_mod += count;
      m_rem += count;
      m_lft--;
    }
    m_mod -= count;
  }